

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O3

void __thiscall Potassco::TheoryData::resizeAtoms(TheoryData *this,uint32_t newSize)

{
  uint uVar1;
  undefined8 *puVar2;
  ulong uVar3;
  Data *this_00;
  
  this_00 = this->data_;
  uVar3 = (this_00->atoms).top;
  uVar1 = (uint)(uVar3 >> 3);
  if (uVar1 != newSize) {
    if (uVar1 < newSize) {
      do {
        (this_00->atoms).top = uVar3 + 8;
        MemoryRegion::grow((MemoryRegion *)this_00,uVar3 + 8);
        puVar2 = (undefined8 *)
                 MemoryRegion::operator[]((MemoryRegion *)this_00,(this_00->atoms).top - 8);
        *puVar2 = 0;
        this_00 = this->data_;
        uVar3 = (this_00->atoms).top;
      } while ((uint32_t)(uVar3 >> 3) != newSize);
    }
    else {
      do {
        uVar3 = uVar3 - 8;
      } while ((uint32_t)(uVar3 >> 3) != newSize);
      (this_00->atoms).top = uVar3;
    }
  }
  return;
}

Assistant:

void TheoryData::resizeAtoms(uint32_t newSize) {
	if (newSize != numAtoms()) {
		if (newSize > numAtoms()) { do { data_->atoms.push(); } while (numAtoms() != newSize); }
		else                      { do { data_->atoms.pop();  } while (numAtoms() != newSize); }
	}
}